

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int check_mapping(saucy *s,int *adj,int *edg,int k)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  
  lVar3 = (long)k;
  uVar2 = (ulong)adj[lVar3];
  piVar4 = edg + uVar2;
  while( true ) {
    iVar5 = adj[lVar3 + 1];
    if ((int)uVar2 == iVar5) break;
    s->stuff[s->gamma[*piVar4]] = '\x01';
    piVar4 = piVar4 + 1;
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  uVar2 = (ulong)adj[s->gamma[lVar3]];
  piVar4 = edg + uVar2;
  iVar1 = 1;
  for (; (iVar1 != 0 && ((int)uVar2 != adj[(long)s->gamma[lVar3] + 1]));
      uVar2 = (ulong)((int)uVar2 + 1)) {
    iVar1 = (int)s->stuff[*piVar4];
    piVar4 = piVar4 + 1;
  }
  uVar2 = (ulong)adj[lVar3];
  piVar4 = edg + uVar2;
  for (; (int)uVar2 != iVar5; uVar2 = (ulong)((int)uVar2 + 1)) {
    s->stuff[s->gamma[*piVar4]] = '\0';
    iVar5 = adj[lVar3 + 1];
    piVar4 = piVar4 + 1;
  }
  return iVar1;
}

Assistant:

static int
check_mapping(struct saucy *s, const int *adj, const int *edg, int k)
{
    int i, gk, ret = 1;

    /* Mark gamma of neighbors */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        s->stuff[s->gamma[edg[i]]] = 1;
    }

    /* Check neighbors of gamma */
    gk = s->gamma[k];
    for (i = adj[gk]; ret && i != adj[gk+1]; ++i) {
        ret = s->stuff[edg[i]];
    }

    /* Clear out bit vector before we leave */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        s->stuff[s->gamma[edg[i]]] = 0;
    }

    return ret;
}